

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadUntilNewline(AsciiParser *this,string *str)

{
  ulong uVar1;
  string sVar2;
  uint8_t uVar3;
  StreamReader *pSVar4;
  uint64_t *puVar5;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  stringstream ss;
  string local_1d0;
  undefined7 uStack_1cf;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  pSVar4 = this->_sr;
  uVar8 = pSVar4->length_;
  uVar6 = pSVar4->idx_;
  if (uVar6 < uVar8) {
    while( true ) {
      puVar5 = &pSVar4->idx_;
      sVar2 = *(string *)(pSVar4->binary_ + uVar6);
      if (sVar2 == (string)0x0) break;
      uVar1 = uVar6 + 1;
      *puVar5 = uVar1;
      if (sVar2 == (string)0xd) {
        if (uVar1 < uVar8 - 1) {
          uVar3 = pSVar4->binary_[uVar6 + 1];
          *puVar5 = uVar6 + 2;
          if (uVar3 != '\n') {
            bVar7 = false;
            if (((long)(uVar6 + 2) < 1) || (bVar7 = false, pSVar4->length_ <= uVar6))
            goto LAB_0035d170;
            *puVar5 = uVar1;
          }
          break;
        }
      }
      else if (sVar2 == (string)0xa) break;
      local_1d0 = sVar2;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1d0,1);
      pSVar4 = this->_sr;
      uVar8 = pSVar4->length_;
      uVar6 = pSVar4->idx_;
      if (uVar8 <= uVar6) break;
    }
  }
  (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
  (this->_curr_cursor).col = 0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::operator=((string *)str,&local_1d0);
  if ((long *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
    operator_delete((long *)CONCAT71(uStack_1cf,local_1d0),local_1c0[0] + 1);
  }
  bVar7 = true;
LAB_0035d170:
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  ::std::ios_base::~ios_base(local_130);
  return bVar7;
}

Assistant:

bool AsciiParser::ReadUntilNewline(std::string *str) {
  std::stringstream ss;

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '\n') {
      break;
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          break;
        }

        // unwind 1 char
        if (!_sr->seek_from_current(-1)) {
          // this should not happen.
          return false;
        }

        break;
      }
    }

    ss << c;
  }

  _curr_cursor.row++;
  _curr_cursor.col = 0;

  (*str) = ss.str();

  return true;
}